

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_end_of_file(GREG *G)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int yypos1012;
  int yythunkpos1012;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  uVar3 = yymatchChar(G,0);
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return uVar3 ^ 1;
}

Assistant:

YY_RULE(int) yy_end_of_file(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "end_of_file"));

  {  int yypos1012= G->pos, yythunkpos1012= G->thunkpos;  if (!yymatchChar(G, '\0')) goto l1012;
  goto l1011;
  l1012:;	  G->pos= yypos1012; G->thunkpos= yythunkpos1012;
  }  yyprintf((stderr, "  ok   end_of_file"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l1011:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "end_of_file"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}